

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineTessellationStateCreateInfo>
          (Impl *this,VkPipelineTessellationStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineTessellationStateCreateInfo *pVVar1;
  void *pvVar2;
  uint32_t uVar3;
  VkStructureType VVar4;
  undefined4 uVar5;
  bool bVar6;
  VkPipelineTessellationStateCreateInfo *pVVar7;
  bool bVar8;
  void *pNext;
  void *local_38;
  
  pVVar1 = *sub_info;
  bVar8 = true;
  if (pVVar1 != (VkPipelineTessellationStateCreateInfo *)0x0) {
    pVVar7 = (VkPipelineTessellationStateCreateInfo *)
             ScratchAllocator::allocate_raw(alloc,0x18,0x10);
    if (pVVar7 != (VkPipelineTessellationStateCreateInfo *)0x0) {
      VVar4 = pVVar1->sType;
      uVar5 = *(undefined4 *)&pVVar1->field_0x4;
      pvVar2 = pVVar1->pNext;
      uVar3 = pVVar1->patchControlPoints;
      pVVar7->flags = pVVar1->flags;
      pVVar7->patchControlPoints = uVar3;
      pVVar7->sType = VVar4;
      *(undefined4 *)&pVVar7->field_0x4 = uVar5;
      pVVar7->pNext = pvVar2;
    }
    *sub_info = pVVar7;
    local_38 = (void *)0x0;
    bVar6 = copy_pnext_chain(this,pVVar7->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar6) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar8 = false;
    }
  }
  return bVar8;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}